

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesMatchOnCornerCases_Test::TestBody
          (DescriptorTest_FieldNamesMatchOnCornerCases_Test *this)

{
  Descriptor *pDVar1;
  ushort *puVar2;
  Nonnull<const_char_*> pcVar3;
  undefined8 extraout_RAX;
  long lVar4;
  char *pcVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_05;
  AssertionResult gtest_ar;
  allocator_type local_99;
  char local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  AssertHelper local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  ulong local_40;
  long local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  long local_18;
  
  local_88.data_ = (AssertHelperData *)0x10c6421;
  local_80 = "fieldName1";
  local_78 = "field_name1";
  local_70 = "field_name1";
  pDVar1 = (this->super_DescriptorTest).message4_;
  lVar4 = (long)pDVar1->field_count_;
  if (lVar4 < 1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,lVar4,"index < field_count()");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    puVar2 = (ushort *)(pDVar1->fields_->all_names_).payload_;
    local_50._M_len = (size_t)*puVar2;
    local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
    local_40 = (ulong)puVar2[3];
    local_38 = (long)puVar2 - (ulong)puVar2[2];
    local_30 = (ulong)puVar2[5];
    local_28 = (long)puVar2 - (ulong)puVar2[4];
    local_20 = (ulong)puVar2[7];
    local_18 = (long)puVar2 - (ulong)puVar2[6];
    __l._M_len = 4;
    __l._M_array = &local_50;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_68,__l,&local_99);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
    ::operator()(local_98,(char *)&local_88,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x10c6447);
    if (local_68.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98[0] == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x3fc,pcVar5);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)local_50._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_len + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_88.data_ = (AssertHelperData *)0x10c64d5;
    local_80 = "fieldName2";
    local_78 = "fieldname2";
    local_70 = "fieldName2";
    pDVar1 = (this->super_DescriptorTest).message4_;
    lVar4 = (long)pDVar1->field_count_;
    if (lVar4 < 2) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,lVar4,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_0055e840;
    puVar2 = (ushort *)pDVar1->fields_[1].all_names_.payload_;
    local_50._M_len = (size_t)*puVar2;
    local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
    local_40 = (ulong)puVar2[3];
    local_38 = (long)puVar2 - (ulong)puVar2[2];
    local_30 = (ulong)puVar2[5];
    local_28 = (long)puVar2 - (ulong)puVar2[4];
    local_20 = (ulong)puVar2[7];
    local_18 = (long)puVar2 - (ulong)puVar2[6];
    __l_00._M_len = 4;
    __l_00._M_array = &local_50;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_68,__l_00,&local_99);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
    ::operator()(local_98,(char *)&local_88,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)"names(message4_->field(1))");
    if (local_68.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98[0] == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x400,pcVar5);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)local_50._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_len + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_88.data_ = (AssertHelperData *)0x10c6506;
    local_80 = "fieldName3";
    local_78 = "fieldname3";
    local_70 = "FieldName3";
    pDVar1 = (this->super_DescriptorTest).message4_;
    lVar4 = (long)pDVar1->field_count_;
    if (lVar4 < 3) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (2,lVar4,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_0055e84d;
    puVar2 = (ushort *)pDVar1->fields_[2].all_names_.payload_;
    local_50._M_len = (size_t)*puVar2;
    local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
    local_40 = (ulong)puVar2[3];
    local_38 = (long)puVar2 - (ulong)puVar2[2];
    local_30 = (ulong)puVar2[5];
    local_28 = (long)puVar2 - (ulong)puVar2[4];
    local_20 = (ulong)puVar2[7];
    local_18 = (long)puVar2 - (ulong)puVar2[6];
    __l_01._M_len = 4;
    __l_01._M_array = &local_50;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_68,__l_01,&local_99);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
    ::operator()(local_98,(char *)&local_88,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)"names(message4_->field(2))");
    if (local_68.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98[0] == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x404,pcVar5);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)local_50._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_len + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_88.data_ = (AssertHelperData *)0x10c655a;
    local_80 = "fieldName4";
    local_78 = "_field_name4";
    local_70 = "_field_name4";
    pDVar1 = (this->super_DescriptorTest).message4_;
    lVar4 = (long)pDVar1->field_count_;
    if (lVar4 < 4) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (3,lVar4,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_0055e85a;
    puVar2 = (ushort *)pDVar1->fields_[3].all_names_.payload_;
    local_50._M_len = (size_t)*puVar2;
    local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
    local_40 = (ulong)puVar2[3];
    local_38 = (long)puVar2 - (ulong)puVar2[2];
    local_30 = (ulong)puVar2[5];
    local_28 = (long)puVar2 - (ulong)puVar2[4];
    local_20 = (ulong)puVar2[7];
    local_18 = (long)puVar2 - (ulong)puVar2[6];
    __l_02._M_len = 4;
    __l_02._M_array = &local_50;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_68,__l_02,&local_99);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
    ::operator()(local_98,(char *)&local_88,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)"names(message4_->field(3))");
    if (local_68.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98[0] == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x408,pcVar5);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)local_50._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_len + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_88.data_ = (AssertHelperData *)0x10c65a3;
    local_80 = "fIELDNAME5";
    local_78 = "field_name5";
    local_70 = "FIELD_NAME5";
    pDVar1 = (this->super_DescriptorTest).message4_;
    lVar4 = (long)pDVar1->field_count_;
    if (lVar4 < 5) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (4,lVar4,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_0055e867;
    puVar2 = (ushort *)pDVar1->fields_[4].all_names_.payload_;
    local_50._M_len = (size_t)*puVar2;
    local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
    local_40 = (ulong)puVar2[3];
    local_38 = (long)puVar2 - (ulong)puVar2[2];
    local_30 = (ulong)puVar2[5];
    local_28 = (long)puVar2 - (ulong)puVar2[4];
    local_20 = (ulong)puVar2[7];
    local_18 = (long)puVar2 - (ulong)puVar2[6];
    __l_03._M_len = 4;
    __l_03._M_array = &local_50;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_68,__l_03,&local_99);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
    ::operator()(local_98,(char *)&local_88,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)"names(message4_->field(4))");
    if (local_68.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98[0] == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x40c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)local_50._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_len + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_88.data_ = (AssertHelperData *)0x10c65e0;
    local_80 = "fieldName6";
    local_78 = "field_name6";
    local_70 = "field_name6";
    pDVar1 = (this->super_DescriptorTest).message4_;
    lVar4 = (long)pDVar1->field_count_;
    if (lVar4 < 6) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (5,lVar4,"index < field_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      puVar2 = (ushort *)pDVar1->fields_[5].all_names_.payload_;
      local_50._M_len = (size_t)*puVar2;
      local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
      local_40 = (ulong)puVar2[3];
      local_38 = (long)puVar2 - (ulong)puVar2[2];
      local_30 = (ulong)puVar2[5];
      local_28 = (long)puVar2 - (ulong)puVar2[4];
      local_20 = (ulong)puVar2[7];
      local_18 = (long)puVar2 - (ulong)puVar2[6];
      __l_04._M_len = 4;
      __l_04._M_array = &local_50;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::vector(&local_68,__l_04,&local_99);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
      ::operator()(local_98,(char *)&local_88,
                   (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)"names(message4_->field(5))");
      if (local_68.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98[0] == '\0') {
        testing::Message::Message((Message *)&local_50);
        if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar5 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x40f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((long *)local_50._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_len + 8))();
        }
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      local_88.data_ = (AssertHelperData *)0x10c6462;
      local_80 = "fieldname7";
      local_78 = "fieldname7";
      local_70 = "fieldname7";
      pDVar1 = (this->super_DescriptorTest).message4_;
      lVar4 = (long)pDVar1->field_count_;
      if (lVar4 < 7) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (6,lVar4,"index < field_count()");
      }
      else {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar3 == (Nonnull<const_char_*>)0x0) {
        puVar2 = (ushort *)pDVar1->fields_[6].all_names_.payload_;
        local_50._M_len = (size_t)*puVar2;
        local_50._M_str = (char *)((long)puVar2 + ~local_50._M_len);
        local_40 = (ulong)puVar2[3];
        local_38 = (long)puVar2 - (ulong)puVar2[2];
        local_30 = (ulong)puVar2[5];
        local_28 = (long)puVar2 - (ulong)puVar2[4];
        local_20 = (ulong)puVar2[7];
        local_18 = (long)puVar2 - (ulong)puVar2[6];
        __l_05._M_len = 4;
        __l_05._M_array = &local_50;
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::vector(&local_68,__l_05,&local_99);
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
        ::operator()(local_98,(char *)&local_88,
                     (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x10c647c);
        if (local_68.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98[0] == '\0') {
          testing::Message::Message((Message *)&local_50);
          if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar5 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x413,pcVar5);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if ((long *)local_50._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_50._M_len + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        return;
      }
      goto LAB_0055e881;
    }
  }
  else {
    TestBody();
LAB_0055e840:
    TestBody();
LAB_0055e84d:
    TestBody();
LAB_0055e85a:
    TestBody();
LAB_0055e867:
    TestBody();
  }
  TestBody();
LAB_0055e881:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((long *)local_50._M_len != (long *)0x0) {
    (**(code **)(*(long *)local_50._M_len + 8))();
  }
  local_50._M_len = 0;
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(DescriptorTest, FieldNamesMatchOnCornerCases) {
  const auto names = [&](auto* field) {
    return std::vector<absl::string_view>{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
  };

  // field_name1
  EXPECT_THAT(
      names(message4_->field(0)),
      ElementsAre("field_name1", "field_name1", "fieldName1", "fieldName1"));
  // fieldName2
  EXPECT_THAT(
      names(message4_->field(1)),
      ElementsAre("fieldName2", "fieldname2", "fieldName2", "fieldName2"));
  // FieldName3
  EXPECT_THAT(
      names(message4_->field(2)),
      ElementsAre("FieldName3", "fieldname3", "fieldName3", "FieldName3"));
  // _field_name4
  EXPECT_THAT(
      names(message4_->field(3)),
      ElementsAre("_field_name4", "_field_name4", "fieldName4", "FieldName4"));
  // FIELD_NAME5
  EXPECT_THAT(
      names(message4_->field(4)),
      ElementsAre("FIELD_NAME5", "field_name5", "fIELDNAME5", "FIELDNAME5"));
  // field_name6, with json name @type
  EXPECT_THAT(names(message4_->field(5)),
              ElementsAre("field_name6", "field_name6", "fieldName6", "@type"));
  // fieldname7
  EXPECT_THAT(
      names(message4_->field(6)),
      ElementsAre("fieldname7", "fieldname7", "fieldname7", "fieldname7"));
}